

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O2

void __thiscall RegionChecker::add(RegionChecker *this,size_t from,size_t to)

{
  ostream *poVar1;
  size_t i;
  reference rVar2;
  
  for (; from < to; from = from + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->usedBits,from);
    *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Added region [");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void RegionChecker::add(size_t from, size_t to) {
	for (size_t i = from; i < to; i++) {
		usedBits[i] = true;
	}

	std::cout << "Added region [" << from << ", " << to << ")" << std::endl;
}